

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O2

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
::elementEnd(ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             *this,ParserChar *elementName)

{
  ElementDataStack *this_00;
  _Elt_pointer pNVar1;
  IUnknownElementHandler *pIVar2;
  undefined1 uVar3;
  char cVar4;
  int iVar5;
  size_t *psVar6;
  _Elt_pointer pEVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  ElementFunctionMap *this_01;
  ElementData elementData;
  StringHashPair local_48;
  size_t local_38;
  void *pvStack_30;
  
  pNVar1 = (this->mNamespacesStack).c.
           super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pNVar1 != (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pNVar1 == (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar1 = (this->mNamespacesStack).c.
               super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
    }
    else {
      pNVar1 = pNVar1 + -1;
    }
    psVar6 = &pNVar1->counter;
    *psVar6 = *psVar6 - 1;
    if (*psVar6 == 0) {
      std::
      deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ::pop_back(&(this->mNamespacesStack).c);
    }
  }
  if (this->mIgnoreElements == 0) {
    if (this->mUnknownElements == 0) {
      if (this->mNamespaceElements != 0) {
        this->mNamespaceElements = this->mNamespaceElements - 1;
        local_48 = Utils::calculateStringHashWithNamespace(elementName);
        uVar3 = (**(code **)(*(long *)this->mActiveNamespaceHandler + 0x18))
                          (this->mActiveNamespaceHandler,&local_48.second,elementName);
        return (bool)uVar3;
      }
      pEVar7 = (this->super_ParserTemplateBase).mElementDataStack.
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pEVar7 != (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (pEVar7 == (this->super_ParserTemplateBase).mElementDataStack.
                      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pEVar7 = (this->super_ParserTemplateBase).mElementDataStack.
                   super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        this_00 = &(this->super_ParserTemplateBase).mElementDataStack;
        local_48.first = pEVar7[-1].elementHash;
        local_48.second = pEVar7[-1].generatedElementHash;
        local_38 = pEVar7[-1].typeID;
        pvStack_30 = pEVar7[-1].validationData;
        this_01 = &this->mElementFunctionMap;
        if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
          this_01 = this->mCurrentElementFunctionMap;
        }
        cVar8 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                ::find(&this_01->_M_t,&local_48.second);
        if (((_Rb_tree_header *)cVar8._M_node != &(this_01->_M_t)._M_impl.super__Rb_tree_header) &&
           (p_Var9 = cVar8._M_node[3]._M_parent, p_Var9 != (_Base_ptr)0x0)) {
          if (((ulong)p_Var9 & 1) != 0) {
            p_Var9 = *(_Base_ptr *)
                      (*(long *)((long)&(cVar8._M_node[3]._M_left)->_M_color + (long)this) + -1 +
                      (long)p_Var9);
          }
          cVar4 = (*(code *)p_Var9)();
          if (cVar4 != '\0') {
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::pop_back(this_00);
            p_Var9 = cVar8._M_node[2]._M_parent;
            if (p_Var9 == (_Base_ptr)0x0) {
              return false;
            }
            if (((ulong)p_Var9 & 1) != 0) {
              p_Var9 = *(_Base_ptr *)
                        (*(long *)((long)&(cVar8._M_node[2]._M_left)->_M_color + (long)this) + -1 +
                        (long)p_Var9);
            }
            cVar4 = (*(code *)p_Var9)();
            if (cVar4 == '\0') {
              return false;
            }
            if (pvStack_30 != (void *)0x0) {
              StackMemoryManager::deleteObject
                        (&(this->super_ParserTemplateBase).mStackMemoryManager);
              return true;
            }
            return true;
          }
        }
        std::
        deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
        ::pop_back(this_00);
      }
      return false;
    }
    this->mUnknownElements = this->mUnknownElements - 1;
    pIVar2 = this->mUnknownHandler;
    if (pIVar2 != (IUnknownElementHandler *)0x0) {
      iVar5 = (*pIVar2->_vptr_IUnknownElementHandler[3])(pIVar2,elementName);
      return SUB41(iVar5,0);
    }
  }
  else {
    this->mIgnoreElements = this->mIgnoreElements - 1;
  }
  return true;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementEnd(const ParserChar* elementName)
	{
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter--;
            if ( mNamespacesStack.top().counter == 0 )
            {
                mNamespacesStack.pop();
            }
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements--;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements--;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementEnd( elementName );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements--;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementEnd( hashPair.second, elementName );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
        {
            mElementDataStack.pop_back();
			return false;
        }
		const FunctionStruct& functions = it->second;

		if ( !functions.validateEndFunction || !(static_cast<DerivedClass*>(this)->*functions.validateEndFunction)())
        {
            mElementDataStack.pop_back();
			return false;
        }

        mElementDataStack.pop_back();

        if ( !functions.endFunction || !(static_cast<DerivedClass*>(this)->*functions.endFunction)() )
			return false;

		if ( elementData.validationData )
			mStackMemoryManager.deleteObject(); // validation data

		return true;
	}